

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_conn.cc
# Opt level: O0

Response * __thiscall
iqxmlrpc::Client_connection::process_session
          (Response *__return_storage_ptr__,Client_connection *this,Request *req,XHeaders *xheaders)

{
  bool bVar1;
  int iVar2;
  Request_header *this_00;
  Client_options *pCVar3;
  string *psVar4;
  Inet_addr *this_01;
  string *p;
  element_type *peVar5;
  XHeaders *xheaders_00;
  undefined4 extraout_var;
  element_type *peVar6;
  Response_header *this_02;
  Error_response *this_03;
  Response_header *res_h;
  auto_ptr<iqxmlrpc::http::Packet> local_c8;
  auto_ptr<iqxmlrpc::http::Packet> res_p;
  Packet req_p;
  string local_80;
  auto_ptr<iqxmlrpc::http::Request_header> local_50;
  auto_ptr<iqxmlrpc::http::Request_header> req_h;
  string req_xml_str;
  XHeaders *xheaders_local;
  Request *req_local;
  Client_connection *this_local;
  
  dump_request_abi_cxx11_((string *)&req_h,(iqxmlrpc *)req,req);
  this_00 = (Request_header *)operator_new(0xb0);
  (*this->_vptr_Client_connection[3])(&local_80);
  pCVar3 = opts(this);
  psVar4 = Client_options::vhost_abi_cxx11_(pCVar3);
  pCVar3 = opts(this);
  this_01 = Client_options::addr(pCVar3);
  iVar2 = iqnet::Inet_addr::get_port(this_01);
  http::Request_header::Request_header(this_00,&local_80,psVar4,iVar2);
  std::auto_ptr<iqxmlrpc::http::Request_header>::auto_ptr(&local_50,this_00);
  std::__cxx11::string::~string((string *)&local_80);
  pCVar3 = opts(this);
  bVar1 = Client_options::has_authinfo(pCVar3);
  if (bVar1) {
    peVar5 = std::auto_ptr<iqxmlrpc::http::Request_header>::operator->(&local_50);
    pCVar3 = opts(this);
    psVar4 = Client_options::auth_user_abi_cxx11_(pCVar3);
    pCVar3 = opts(this);
    p = Client_options::auth_passwd_abi_cxx11_(pCVar3);
    http::Request_header::set_authinfo(peVar5,psVar4,p);
  }
  peVar5 = std::auto_ptr<iqxmlrpc::http::Request_header>::operator->(&local_50);
  pCVar3 = opts(this);
  xheaders_00 = Client_options::xheaders(pCVar3);
  http::Header::set_xheaders(&peVar5->super_Header,xheaders_00);
  peVar5 = std::auto_ptr<iqxmlrpc::http::Request_header>::operator->(&local_50);
  http::Header::set_xheaders(&peVar5->super_Header,xheaders);
  peVar5 = std::auto_ptr<iqxmlrpc::http::Request_header>::release(&local_50);
  http::Packet::Packet((Packet *)&res_p,&peVar5->super_Header,(string *)&req_h);
  pCVar3 = opts(this);
  bVar1 = Client_options::keep_alive(pCVar3);
  http::Packet::set_keep_alive((Packet *)&res_p,bVar1);
  http::Packet::dump_abi_cxx11_((string *)&res_h,(Packet *)&res_p);
  iVar2 = (*this->_vptr_Client_connection[2])(this,&res_h);
  std::auto_ptr<iqxmlrpc::http::Packet>::auto_ptr
            (&local_c8,(element_type *)CONCAT44(extraout_var,iVar2));
  std::__cxx11::string::~string((string *)&res_h);
  peVar6 = std::auto_ptr<iqxmlrpc::http::Packet>::operator->(&local_c8);
  this_02 = (Response_header *)http::Packet::header(peVar6);
  iVar2 = http::Response_header::code(this_02);
  if (iVar2 == 200) {
    peVar6 = std::auto_ptr<iqxmlrpc::http::Packet>::operator->(&local_c8);
    psVar4 = http::Packet::content_abi_cxx11_(peVar6);
    parse_response(__return_storage_ptr__,psVar4);
    std::auto_ptr<iqxmlrpc::http::Packet>::~auto_ptr(&local_c8);
    http::Packet::~Packet((Packet *)&res_p);
    std::auto_ptr<iqxmlrpc::http::Request_header>::~auto_ptr(&local_50);
    std::__cxx11::string::~string((string *)&req_h);
    return __return_storage_ptr__;
  }
  this_03 = (Error_response *)__cxa_allocate_exception(0x50);
  psVar4 = http::Response_header::phrase_abi_cxx11_(this_02);
  iVar2 = http::Response_header::code(this_02);
  http::Error_response::Error_response(this_03,psVar4,iVar2);
  __cxa_throw(this_03,&http::Error_response::typeinfo,http::Error_response::~Error_response);
}

Assistant:

Response Client_connection::process_session( const Request& req, const XHeaders& xheaders )
{
  using namespace http;

  std::string req_xml_str( dump_request(req) );

  std::auto_ptr<Request_header> req_h(
    new Request_header(
      decorate_uri(),
      opts().vhost(),
      opts().addr().get_port() ));

  if (opts().has_authinfo())
    req_h->set_authinfo( opts().auth_user(), opts().auth_passwd() );

  req_h->set_xheaders( opts().xheaders() );
  req_h->set_xheaders( xheaders );

  Packet req_p( req_h.release(), req_xml_str );
  req_p.set_keep_alive( opts().keep_alive() );

  // Received packet
  std::auto_ptr<Packet> res_p( do_process_session(req_p.dump()) );

  const Response_header* res_h =
    static_cast<const Response_header*>(res_p->header());

  if( res_h->code() != 200 )
    throw Error_response( res_h->phrase(), res_h->code() );

  return parse_response( res_p->content() );
}